

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

pair<__gnu_cxx::__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>,_bool>
 pdqsort_detail::
 partition_right_branchless<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,std::less<FractionalInteger>>
           (double *begin,FractionalInteger *end,pointer param_3)

{
  double *pdVar1;
  uchar *offsets_l;
  undefined8 *puVar2;
  double dVar3;
  byte bVar4;
  HighsInt HVar5;
  pointer ppVar6;
  char cVar7;
  double dVar8;
  double dVar9;
  pointer ppVar10;
  pointer ppVar11;
  double dVar12;
  double dVar13;
  undefined8 uVar14;
  pointer ppVar15;
  pointer ppVar16;
  double dVar17;
  double dVar18;
  undefined8 uVar19;
  pointer ppVar20;
  undefined8 uVar21;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  _Var22;
  FractionalInteger *pFVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  pointer extraout_RDX;
  pointer extraout_RDX_00;
  pointer extraout_RDX_01;
  ulong uVar29;
  void *pvVar30;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  first;
  pointer ppVar31;
  FractionalInteger *pFVar32;
  long lVar33;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  last;
  ulong uVar34;
  FractionalInteger *pFVar35;
  ulong uVar36;
  FractionalInteger *pFVar37;
  pair<__gnu_cxx::__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>,_bool>
  pVar38;
  uchar offsets_l_storage [128];
  uchar offsets_r_storage [128];
  ulong local_1d8;
  undefined4 local_19c;
  undefined4 uStack_198;
  undefined4 local_12c;
  undefined4 uStack_128;
  byte bStack_101;
  uchar local_100 [127];
  byte bStack_81;
  uchar local_80 [80];
  
  dVar8 = *begin;
  dVar9 = begin[1];
  dVar3 = begin[2];
  HVar5 = *(HighsInt *)(begin + 3);
  ppVar10 = (pointer)begin[4];
  ppVar11 = (pointer)begin[5];
  ppVar6 = (pointer)begin[6];
  begin[4] = 0.0;
  begin[5] = 0.0;
  begin[6] = 0.0;
  lVar24 = 0;
  lVar33 = 0;
  do {
    lVar27 = lVar33;
    lVar24 = lVar24 + -0x38;
    lVar33 = lVar27 + 0x38;
  } while (dVar3 < *(double *)((long)begin + lVar27 + 0x48));
  pFVar35 = (FractionalInteger *)((long)begin - lVar24);
  if (lVar24 == -0x38) {
    do {
      if (end <= pFVar35) break;
      pFVar32 = end + -1;
      end = end + -1;
    } while (pFVar32->score <= dVar3);
  }
  else {
    do {
      pFVar32 = end + -1;
      end = end + -1;
    } while (pFVar32->score <= dVar3);
  }
  if (pFVar35 < end) {
    pdVar1 = (double *)((long)begin + lVar27 + 0x38);
    dVar12 = *pdVar1;
    dVar13 = pdVar1[1];
    uVar14 = *(undefined8 *)((long)pdVar1 + 0x14);
    uStack_128 = (undefined4)((ulong)*(undefined8 *)((long)pdVar1 + 0xc) >> 0x20);
    local_12c = (undefined4)((ulong)dVar13 >> 0x20);
    ppVar31 = *(pointer *)((long)begin + lVar27 + 0x68);
    puVar2 = (undefined8 *)((long)begin + lVar27 + 0x58);
    ppVar15 = (pointer)*puVar2;
    ppVar16 = (pointer)puVar2[1];
    puVar2 = (undefined8 *)((long)begin + lVar27 + 0x58);
    *puVar2 = 0;
    puVar2[1] = 0;
    *(undefined8 *)((long)begin + lVar27 + 0x68) = 0;
    dVar17 = end->fractionality;
    dVar18 = end->row_ep_norm2;
    uVar19 = *(undefined8 *)((long)&end->score + 4);
    *(undefined8 *)((long)pdVar1 + 0xc) = *(undefined8 *)((long)&end->row_ep_norm2 + 4);
    *(undefined8 *)((long)pdVar1 + 0x14) = uVar19;
    *pdVar1 = dVar17;
    pdVar1[1] = dVar18;
    ppVar20 = (end->row_ep).
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    puVar2 = (undefined8 *)((long)begin + lVar27 + 0x58);
    *puVar2 = (end->row_ep).
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    puVar2[1] = ppVar20;
    param_3 = (end->row_ep).
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    *(pointer *)((long)begin + lVar27 + 0x68) = param_3;
    *(ulong *)((long)&end->row_ep_norm2 + 4) = CONCAT44(uStack_128,local_12c);
    *(undefined8 *)((long)&end->score + 4) = uVar14;
    end->fractionality = dVar12;
    end->row_ep_norm2 = dVar13;
    (end->row_ep).
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_start = ppVar15;
    (end->row_ep).
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVar16;
    (end->row_ep).
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = ppVar31;
    pFVar32 = (FractionalInteger *)((long)begin + (0x38 - lVar24));
    if (pFVar32 < end) {
      local_1d8 = 0;
      lVar33 = 0;
      uVar29 = 0;
      uVar36 = 0;
      first._M_current = pFVar32;
      last._M_current = end;
      pFVar37 = end;
      do {
        uVar34 = 0;
        uVar25 = ((long)pFVar37 - (long)pFVar32 >> 3) * 0x6db6db6db6db6db7;
        uVar26 = uVar25 >> (uVar29 == 0);
        if (uVar36 != 0) {
          uVar26 = uVar34;
        }
        uVar25 = uVar25 - uVar26;
        if (uVar29 != 0) {
          uVar25 = uVar34;
        }
        if (uVar26 < 0x40) {
          if (uVar26 != 0) {
            uVar28 = 0;
            do {
              local_100[uVar36] = (char)uVar28;
              uVar28 = uVar28 + 1;
              uVar36 = uVar36 + (pFVar32->score <= dVar3);
              pFVar32 = pFVar32 + 1;
            } while (uVar26 != uVar28);
          }
        }
        else {
          uVar26 = 0xfffffffffffffff8;
          do {
            uVar28 = uVar26 + 8;
            local_100[uVar36] = (char)uVar28;
            lVar24 = (pFVar32->score <= dVar3) + uVar36;
            cVar7 = (char)uVar26;
            local_100[lVar24] = cVar7 + '\t';
            lVar24 = (ulong)(pFVar32[1].score <= dVar3) + lVar24;
            local_100[lVar24] = cVar7 + '\n';
            lVar24 = (ulong)(pFVar32[2].score <= dVar3) + lVar24;
            local_100[lVar24] = cVar7 + '\v';
            lVar24 = (ulong)(pFVar32[3].score <= dVar3) + lVar24;
            local_100[lVar24] = cVar7 + '\f';
            lVar24 = (ulong)(pFVar32[4].score <= dVar3) + lVar24;
            local_100[lVar24] = cVar7 + '\r';
            lVar24 = (ulong)(pFVar32[5].score <= dVar3) + lVar24;
            local_100[lVar24] = cVar7 + '\x0e';
            lVar24 = (ulong)(pFVar32[6].score <= dVar3) + lVar24;
            local_100[lVar24] = cVar7 + '\x0f';
            uVar36 = (ulong)(pFVar32[7].score <= dVar3) + lVar24;
            pFVar32 = pFVar32 + 8;
            uVar26 = uVar28;
          } while (uVar28 < 0x38);
        }
        if (uVar25 < 0x40) {
          if (uVar25 != 0) {
            uVar26 = 0;
            do {
              uVar26 = uVar26 + 1;
              local_80[uVar29] = (char)uVar26;
              pFVar23 = pFVar37 + -1;
              pFVar37 = pFVar37 + -1;
              uVar29 = uVar29 + (dVar3 < pFVar23->score);
            } while (uVar25 != uVar26);
          }
        }
        else {
          uVar26 = 0xfffffffffffffff8;
          do {
            cVar7 = (char)uVar26;
            local_80[uVar29] = cVar7 + '\t';
            lVar24 = (dVar3 < pFVar37[-1].score) + uVar29;
            local_80[lVar24] = cVar7 + '\n';
            lVar24 = (ulong)(dVar3 < pFVar37[-2].score) + lVar24;
            local_80[lVar24] = cVar7 + '\v';
            lVar24 = (ulong)(dVar3 < pFVar37[-3].score) + lVar24;
            local_80[lVar24] = cVar7 + '\f';
            lVar24 = (ulong)(dVar3 < pFVar37[-4].score) + lVar24;
            local_80[lVar24] = cVar7 + '\r';
            lVar24 = (ulong)(dVar3 < pFVar37[-5].score) + lVar24;
            local_80[lVar24] = cVar7 + '\x0e';
            lVar24 = (ulong)(dVar3 < pFVar37[-6].score) + lVar24;
            local_80[lVar24] = cVar7 + '\x0f';
            lVar24 = (ulong)(dVar3 < pFVar37[-7].score) + lVar24;
            local_80[lVar24] = cVar7 + '\x10';
            pFVar23 = pFVar37 + -8;
            pFVar37 = pFVar37 + -8;
            uVar29 = (ulong)(dVar3 < pFVar23->score) + lVar24;
            uVar26 = uVar26 + 8;
          } while (uVar26 < 0x38);
        }
        uVar26 = uVar36;
        if (uVar29 < uVar36) {
          uVar26 = uVar29;
        }
        offsets_l = local_100 + local_1d8;
        local_1d8 = local_1d8 + uVar26;
        _Var22._M_current = first._M_current;
        if (uVar36 <= uVar29) {
          local_1d8 = uVar34;
          _Var22._M_current = pFVar32;
        }
        swap_offsets<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>>
                  (first,last,offsets_l,local_80 + lVar33,uVar26,uVar36 == uVar29);
        uVar36 = uVar36 - uVar26;
        uVar29 = uVar29 - uVar26;
        lVar33 = lVar33 + uVar26;
        if (uVar29 == 0) {
          lVar33 = 0;
          last._M_current = pFVar37;
        }
        first._M_current = _Var22._M_current;
        param_3 = extraout_RDX;
      } while (pFVar32 < pFVar37);
      for (; uVar36 != 0; uVar36 = uVar36 - 1) {
        bVar4 = (&bStack_101)[uVar36 + local_1d8];
        pFVar32 = (FractionalInteger *)((long)pFVar37 + 0xffffffffffffffc8);
        dVar12 = _Var22._M_current[bVar4].fractionality;
        dVar13 = _Var22._M_current[bVar4].row_ep_norm2;
        puVar2 = (undefined8 *)((long)&_Var22._M_current[bVar4].row_ep_norm2 + 4);
        uVar14 = puVar2[1];
        uStack_198 = (undefined4)((ulong)*puVar2 >> 0x20);
        local_19c = (undefined4)((ulong)dVar13 >> 0x20);
        param_3 = _Var22._M_current[bVar4].row_ep.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        ppVar31 = _Var22._M_current[bVar4].row_ep.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar15 = _Var22._M_current[bVar4].row_ep.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        _Var22._M_current[bVar4].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        _Var22._M_current[bVar4].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        _Var22._M_current[bVar4].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        dVar17 = ((FractionalInteger *)((long)pFVar37 + 0xffffffffffffffc8))->row_ep_norm2;
        uVar19 = *(undefined8 *)
                  ((long)&((FractionalInteger *)((long)pFVar37 + 0xffffffffffffffc8))->row_ep_norm2
                  + 4);
        uVar21 = *(undefined8 *)
                  ((long)&((FractionalInteger *)((long)pFVar37 + 0xffffffffffffffc8))->score + 4);
        _Var22._M_current[bVar4].fractionality =
             ((FractionalInteger *)((long)pFVar37 + 0xffffffffffffffc8))->fractionality;
        _Var22._M_current[bVar4].row_ep_norm2 = dVar17;
        puVar2 = (undefined8 *)((long)&_Var22._M_current[bVar4].row_ep_norm2 + 4);
        *puVar2 = uVar19;
        puVar2[1] = uVar21;
        ppVar16 = (((FractionalInteger *)((long)pFVar37 + 0xffffffffffffffc8))->row_ep).
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        _Var22._M_current[bVar4].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start =
             (((FractionalInteger *)((long)pFVar37 + 0xffffffffffffffc8))->row_ep).
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
        _Var22._M_current[bVar4].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = ppVar16;
        _Var22._M_current[bVar4].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage =
             (((FractionalInteger *)((long)pFVar37 + 0xffffffffffffffc8))->row_ep).
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        *(ulong *)((long)&((FractionalInteger *)((long)pFVar37 + 0xffffffffffffffc8))->row_ep_norm2
                  + 4) = CONCAT44(uStack_198,local_19c);
        *(undefined8 *)
         ((long)&((FractionalInteger *)((long)pFVar37 + 0xffffffffffffffc8))->score + 4) = uVar14;
        ((FractionalInteger *)((long)pFVar37 + 0xffffffffffffffc8))->fractionality = dVar12;
        ((FractionalInteger *)((long)pFVar37 + 0xffffffffffffffc8))->row_ep_norm2 = dVar13;
        (((FractionalInteger *)((long)pFVar37 + 0xffffffffffffffc8))->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start = ppVar31;
        (((FractionalInteger *)((long)pFVar37 + 0xffffffffffffffc8))->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = ppVar15;
        (((FractionalInteger *)((long)pFVar37 + 0xffffffffffffffc8))->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = param_3;
        pFVar37 = pFVar32;
      }
      for (; uVar29 != 0; uVar29 = uVar29 - 1) {
        uVar36 = (ulong)(&bStack_81)[uVar29 + lVar33];
        dVar12 = last._M_current[-uVar36].fractionality;
        dVar13 = last._M_current[-uVar36].row_ep_norm2;
        puVar2 = (undefined8 *)((long)&last._M_current[-uVar36].row_ep_norm2 + 4);
        uVar14 = puVar2[1];
        uStack_198 = (undefined4)((ulong)*puVar2 >> 0x20);
        local_19c = (undefined4)((ulong)dVar13 >> 0x20);
        param_3 = last._M_current[-uVar36].row_ep.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        ppVar31 = last._M_current[-uVar36].row_ep.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar15 = last._M_current[-uVar36].row_ep.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        last._M_current[-uVar36].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        last._M_current[-uVar36].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        last._M_current[-uVar36].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        dVar17 = *(double *)((long)pFVar32 + 8);
        uVar19 = *(double *)((long)pFVar32 + 0xc);
        uVar21 = *(double *)((long)pFVar32 + 0x14);
        last._M_current[-uVar36].fractionality = pFVar32->fractionality;
        last._M_current[-uVar36].row_ep_norm2 = dVar17;
        puVar2 = (undefined8 *)((long)&last._M_current[-uVar36].row_ep_norm2 + 4);
        *puVar2 = uVar19;
        puVar2[1] = uVar21;
        ppVar16 = *(pointer *)
                   &((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                    ((long)pFVar32 + 0x28))->
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
        ;
        last._M_current[-uVar36].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start =
             *(pointer *)
              &((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               ((long)pFVar32 + 0x20))->
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>;
        last._M_current[-uVar36].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = ppVar16;
        last._M_current[-uVar36].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage =
             *(pointer *)
              &((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               ((long)pFVar32 + 0x30))->
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>;
        *(ulong *)((long)pFVar32 + 0xc) = CONCAT44(uStack_198,local_19c);
        *(undefined8 *)((long)pFVar32 + 0x14) = uVar14;
        pFVar32->fractionality = dVar12;
        *(double *)((long)pFVar32 + 8) = dVar13;
        *(pointer *)
         &((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
          ((long)pFVar32 + 0x20))->
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> =
             ppVar31;
        *(pointer *)
         &((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
          ((long)pFVar32 + 0x28))->
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> =
             ppVar15;
        *(pointer *)
         &((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
          ((long)pFVar32 + 0x30))->
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> =
             param_3;
        pFVar32 = (FractionalInteger *)((long)pFVar32 + 0x38);
      }
    }
    pvVar30 = (void *)begin[4];
  }
  else {
    pvVar30 = (void *)0x0;
    pFVar32 = pFVar35;
  }
  dVar12 = pFVar32[-1].fractionality;
  dVar13 = pFVar32[-1].row_ep_norm2;
  uVar14 = *(undefined8 *)((long)&pFVar32[-1].score + 4);
  *(undefined8 *)((long)begin + 0xc) = *(undefined8 *)((long)&pFVar32[-1].row_ep_norm2 + 4);
  *(undefined8 *)((long)begin + 0x14) = uVar14;
  *begin = dVar12;
  begin[1] = dVar13;
  ppVar31 = pFVar32[-1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  begin[4] = (double)pFVar32[-1].row_ep.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
  begin[5] = (double)ppVar31;
  begin[6] = (double)pFVar32[-1].row_ep.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pFVar32[-1].row_ep.
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pFVar32[-1].row_ep.
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pFVar32[-1].row_ep.
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pvVar30 == (void *)0x0) {
    ppVar31 = (pointer)0x0;
  }
  else {
    operator_delete(pvVar30);
    ppVar31 = pFVar32[-1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    param_3 = extraout_RDX_00;
  }
  pFVar32[-1].fractionality = dVar8;
  pFVar32[-1].row_ep_norm2 = dVar9;
  pFVar32[-1].score = dVar3;
  pFVar32[-1].basisIndex = HVar5;
  pFVar32[-1].row_ep.
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  super__Vector_impl_data._M_start = ppVar10;
  pFVar32[-1].row_ep.
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = ppVar11;
  pFVar32[-1].row_ep.
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = ppVar6;
  if (ppVar31 != (pointer)0x0) {
    operator_delete(ppVar31);
    param_3 = extraout_RDX_01;
  }
  pVar38._9_7_ = (undefined7)((ulong)param_3 >> 8);
  pVar38.second = end <= pFVar35;
  pVar38.first._M_current = pFVar32 + -1;
  return pVar38;
}

Assistant:

inline std::pair<Iter, bool> partition_right_branchless(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;

        // Move pivot into local for speed.
        T pivot(PDQSORT_PREFER_MOVE(*begin));
        Iter first = begin;
        Iter last = end;

        // Find the first element greater than or equal than the pivot (the median of 3 guarantees
        // this exists).
        while (comp(*++first, pivot));

        // Find the first element strictly smaller than the pivot. We have to guard this search if
        // there was no element before *first.
        if (first - 1 == begin) while (first < last && !comp(*--last, pivot));
        else                    while (                !comp(*--last, pivot));

        // If the first pair of elements that should be swapped to partition are the same element,
        // the passed in sequence already was correctly partitioned.
        bool already_partitioned = first >= last;
        if (!already_partitioned) {
            std::iter_swap(first, last);
            ++first;

            // The following branchless partitioning is derived from "BlockQuicksort: How Branch
            // Mispredictions don’t affect Quicksort" by Stefan Edelkamp and Armin Weiss, but
            // heavily micro-optimized.
            unsigned char offsets_l_storage[block_size + cacheline_size];
            unsigned char offsets_r_storage[block_size + cacheline_size];
            unsigned char* offsets_l = align_cacheline(offsets_l_storage);
            unsigned char* offsets_r = align_cacheline(offsets_r_storage);

            Iter offsets_l_base = first;
            Iter offsets_r_base = last;
            size_t num_l, num_r, start_l, start_r;
            num_l = num_r = start_l = start_r = 0;
            
            while (first < last) {
                // Fill up offset blocks with elements that are on the wrong side.
                // First we determine how much elements are considered for each offset block.
                size_t num_unknown = last - first;
                size_t left_split = num_l == 0 ? (num_r == 0 ? num_unknown / 2 : num_unknown) : 0;
                size_t right_split = num_r == 0 ? (num_unknown - left_split) : 0;

                // Fill the offset blocks.
                if (left_split >= block_size) {
                    for (size_t i = 0; i < block_size;) {
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                    }
                } else {
                    for (size_t i = 0; i < left_split;) {
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                    }
                }

                if (right_split >= block_size) {
                    for (size_t i = 0; i < block_size;) {
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                    }
                } else {
                    for (size_t i = 0; i < right_split;) {
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                    }
                }

                // Swap elements and update block sizes and first/last boundaries.
                size_t num = std::min(num_l, num_r);
                swap_offsets(offsets_l_base, offsets_r_base,
                             offsets_l + start_l, offsets_r + start_r,
                             num, num_l == num_r);
                num_l -= num; num_r -= num;
                start_l += num; start_r += num;

                if (num_l == 0) {
                    start_l = 0;
                    offsets_l_base = first;
                }
                
                if (num_r == 0) {
                    start_r = 0;
                    offsets_r_base = last;
                }
            }

            // We have now fully identified [first, last)'s proper position. Swap the last elements.
            if (num_l) {
                offsets_l += start_l;
                while (num_l--) std::iter_swap(offsets_l_base + offsets_l[num_l], --last);
                first = last;
            }
            if (num_r) {
                offsets_r += start_r;
                while (num_r--) std::iter_swap(offsets_r_base - offsets_r[num_r], first), ++first;
                last = first;
            }
        }

        // Put the pivot in the right place.
        Iter pivot_pos = first - 1;
        *begin = PDQSORT_PREFER_MOVE(*pivot_pos);
        *pivot_pos = PDQSORT_PREFER_MOVE(pivot);

        return std::make_pair(pivot_pos, already_partitioned);
    }